

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

int Ivy_FraigRefineClass_rec(Ivy_FraigMan_t *p,Ivy_Obj_t *pClass)

{
  int *piVar1;
  Ivy_Obj_t **ppIVar2;
  uint uVar3;
  Ivy_Obj_t *pIVar4;
  int iVar5;
  Ivy_Obj_t **ppIVar6;
  Ivy_FraigSim_t *pSims0;
  Ivy_Obj_t *pIVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  Ivy_Obj_t *pIVar11;
  Ivy_Obj_t *pClass_00;
  int w;
  ulong uVar12;
  long lVar13;
  Ivy_Obj_t *pIVar14;
  long lVar15;
  
  pIVar11 = pClass->pNextFan1;
  if (pIVar11 != (Ivy_Obj_t *)0x0) {
    ppIVar6 = &pClass->pNextFan1;
    iVar8 = 0;
    do {
      pIVar4 = pClass->pFanout;
      uVar10 = p->nSimWords;
      uVar9 = (ulong)uVar10;
      pIVar7 = pClass;
      pClass_00 = pIVar11;
      while ((int)uVar10 < 1) {
LAB_007984a8:
        ppIVar2 = &pClass_00->pNextFan1;
        pIVar7 = pClass_00;
        pClass_00 = *ppIVar2;
        if (*ppIVar2 == (Ivy_Obj_t *)0x0) goto LAB_007985c5;
      }
      pIVar11 = pClass_00->pFanout;
      uVar12 = 0;
      while (*(int *)((long)&pIVar4->pFanout + uVar12 * 4) ==
             *(int *)((long)&pIVar11->pFanout + uVar12 * 4)) {
        uVar12 = uVar12 + 1;
        if (uVar9 == uVar12) goto LAB_007984a8;
      }
      if (p->pParams->fPatScores != 0) {
        lVar13 = 0;
        do {
          uVar10 = *(uint *)((long)&pIVar4->pFanout + lVar13 * 4);
          uVar3 = *(uint *)((long)&pIVar11->pFanout + lVar13 * 4);
          if (uVar10 != uVar3) {
            lVar15 = 0;
            do {
              if (((uVar3 ^ uVar10) >> ((uint)lVar15 & 0x1f) & 1) != 0) {
                p->pPatScores[(ulong)((uint)lVar13 & 0x7ffffff) * 0x20 + lVar15] =
                     p->pPatScores[(ulong)((uint)lVar13 & 0x7ffffff) * 0x20 + lVar15] + 1;
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 != 0x20);
            uVar9 = (ulong)(uint)p->nSimWords;
          }
          lVar13 = lVar13 + 1;
          uVar10 = (uint)uVar9;
        } while (lVar13 < (int)uVar10);
      }
      pClass_00->pNextFan0 = (Ivy_Obj_t *)0x0;
      pIVar11 = pClass_00->pNextFan1;
      pIVar14 = pClass_00;
      if (pIVar11 != (Ivy_Obj_t *)0x0) {
        do {
          if ((int)uVar10 < 1) {
LAB_0079854a:
            pIVar7->pNextFan1 = pIVar11;
            pIVar7 = pIVar11;
          }
          else {
            uVar9 = 0;
            while (*(int *)((long)&pIVar4->pFanout + uVar9 * 4) ==
                   *(int *)((long)&pIVar11->pFanout->pFanout + uVar9 * 4)) {
              uVar9 = uVar9 + 1;
              if (uVar10 == uVar9) goto LAB_0079854a;
            }
            pIVar14->pNextFan1 = pIVar11;
            pIVar11->pNextFan0 = pClass_00;
            pIVar14 = pIVar11;
          }
          pIVar11 = pIVar11->pNextFan1;
        } while (pIVar11 != (Ivy_Obj_t *)0x0);
      }
      pIVar14->pNextFan1 = (Ivy_Obj_t *)0x0;
      pIVar7->pNextFan1 = (Ivy_Obj_t *)0x0;
      pClass_00->pPrevFan1 = pClass;
      pIVar11 = pClass->pPrevFan0;
      pClass_00->pPrevFan0 = pIVar11;
      if (pIVar11 != (Ivy_Obj_t *)0x0) {
        pIVar11->pPrevFan1 = pClass_00;
      }
      pClass->pPrevFan0 = pClass_00;
      if ((p->lClasses).pTail == pClass) {
        (p->lClasses).pTail = pClass_00;
      }
      piVar1 = &(p->lClasses).nItems;
      *piVar1 = *piVar1 + 1;
      if (*ppIVar6 == (Ivy_Obj_t *)0x0) {
        Ivy_FraigRemoveClass(&p->lClasses,pClass);
      }
      ppIVar6 = &pClass_00->pNextFan1;
      pIVar11 = *ppIVar6;
      if (pIVar11 == (Ivy_Obj_t *)0x0) {
        Ivy_FraigRemoveClass(&p->lClasses,pClass_00);
        iVar5 = 1;
        goto LAB_007985c7;
      }
      iVar8 = iVar8 + 1;
      pClass = pClass_00;
    } while( true );
  }
  iVar8 = 0;
LAB_007985c5:
  iVar5 = 0;
LAB_007985c7:
  return iVar8 + iVar5;
}

Assistant:

int Ivy_FraigRefineClass_rec( Ivy_FraigMan_t * p, Ivy_Obj_t * pClass )
{
    Ivy_Obj_t * pClassNew, * pListOld, * pListNew, * pNode;
    int RetValue = 0;
    // check if there is refinement
    pListOld = pClass;
    Ivy_FraigForEachClassNode( Ivy_ObjClassNodeNext(pClass), pClassNew )
    {
        if ( !Ivy_NodeCompareSims(p, pClass, pClassNew) )
        {
            if ( p->pParams->fPatScores )
                Ivy_FraigAddToPatScores( p, pClass, pClassNew );
            break;
        }
        pListOld = pClassNew;
    }
    if ( pClassNew == NULL )
        return 0;
    // set representative of the new class
    Ivy_ObjSetClassNodeRepr( pClassNew, NULL );
    // start the new list
    pListNew = pClassNew;
    // go through the remaining nodes and sort them into two groups:
    // (1) matches of the old node; (2) non-matches of the old node
    Ivy_FraigForEachClassNode( Ivy_ObjClassNodeNext(pClassNew), pNode )
        if ( Ivy_NodeCompareSims( p, pClass, pNode ) )
        {
            Ivy_ObjSetClassNodeNext( pListOld, pNode );
            pListOld = pNode;
        }
        else
        {
            Ivy_ObjSetClassNodeNext( pListNew, pNode );
            Ivy_ObjSetClassNodeRepr( pNode, pClassNew );
            pListNew = pNode;
        }
    // finish both lists
    Ivy_ObjSetClassNodeNext( pListNew, NULL );
    Ivy_ObjSetClassNodeNext( pListOld, NULL );
    // update the list of classes
    Ivy_FraigInsertClass( &p->lClasses, pClass, pClassNew );
    // if the old class is trivial, remove it
    if ( Ivy_ObjClassNodeNext(pClass) == NULL )
        Ivy_FraigRemoveClass( &p->lClasses, pClass );
    // if the new class is trivial, remove it; otherwise, try to refine it
    if ( Ivy_ObjClassNodeNext(pClassNew) == NULL )
        Ivy_FraigRemoveClass( &p->lClasses, pClassNew );
    else
        RetValue = Ivy_FraigRefineClass_rec( p, pClassNew );
    return RetValue + 1;
}